

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SetUniqueFlag(sqlite3_index_info *pIdxInfo)

{
  sqlite3_index_info *pIdxInfo_local;
  
  pIdxInfo->idxFlags = pIdxInfo->idxFlags | 1;
  return;
}

Assistant:

static void fts5SetUniqueFlag(sqlite3_index_info *pIdxInfo){
#if SQLITE_VERSION_NUMBER>=3008012
#ifndef SQLITE_CORE
  if( sqlite3_libversion_number()>=3008012 )
#endif
  {
    pIdxInfo->idxFlags |= SQLITE_INDEX_SCAN_UNIQUE;
  }
#endif
}